

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main_inner(int argc,char **argv)

{
  function<void_(const_char_*)> *pfVar1;
  function<void_()> *pfVar2;
  _Manager_type p_Var3;
  undefined8 uVar4;
  bool bVar5;
  FILE *__stream;
  ulong uVar6;
  size_t sVar7;
  _func_void__Any_data_ptr_char_ptr_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  int iVar8;
  uint uVar9;
  CLICallbacks cbs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spirv_file;
  string json;
  CLIParser parser;
  string compiled_output;
  CLIArguments args;
  Parser spirv_parser;
  _Any_data __tmp;
  CLICallbacks local_3ea0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3e28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3e08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3df0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3dd8;
  string local_3dc0;
  CLICallbacks local_3da0;
  CLIParser local_3d28;
  undefined **local_3c98 [2];
  _Manager_type local_3c88;
  _Invoker_type p_Stack_3c80;
  undefined1 local_1f82;
  undefined8 local_1878;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1870;
  undefined1 local_1868 [176];
  undefined4 local_17b8;
  uint *local_17b0;
  size_t sStack_17a8;
  size_t local_17a0;
  uint local_1798 [8];
  uint *local_1778;
  size_t sStack_1770;
  size_t local_1768;
  uint local_1760 [8];
  pair<unsigned_int,_unsigned_int> *local_1740;
  size_t sStack_1738;
  size_t local_1730;
  pair<unsigned_int,_unsigned_int> local_1728 [8];
  pair<unsigned_int,_unsigned_int> *local_16e8;
  size_t sStack_16e0;
  size_t local_16d8;
  pair<unsigned_int,_unsigned_int> local_16d0 [8];
  MSLShaderInput *local_1690;
  size_t sStack_1688;
  size_t local_1680;
  MSLShaderInput local_1678 [8];
  PLSArg *local_15f8;
  size_t sStack_15f0;
  size_t local_15e8;
  PLSArg local_15e0 [8];
  PLSArg *local_14a0;
  size_t sStack_1498;
  size_t local_1490;
  PLSArg local_1488 [8];
  Remap *local_1348;
  size_t sStack_1340;
  size_t local_1338;
  Remap local_1330 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10f0;
  size_t sStack_10e8;
  size_t local_10e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8 [8];
  VariableTypeRemap *local_fd8;
  size_t sStack_fd0;
  size_t local_fc8;
  VariableTypeRemap local_fc0 [8];
  InterfaceVariableRename *local_dc0;
  size_t sStack_db8;
  size_t local_db0;
  InterfaceVariableRename local_da8 [8];
  HLSLVertexAttributeRemap *local_c68;
  size_t sStack_c60;
  size_t local_c58;
  HLSLVertexAttributeRemap local_c50 [8];
  _Alloc_hider local_b10;
  size_type local_b08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b00;
  _Alloc_hider local_af0;
  size_type local_ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ae0;
  Rename *local_ad0;
  size_t sStack_ac8;
  size_t local_ac0;
  Rename local_ab8 [8];
  uint local_878;
  bool local_874;
  string local_870;
  undefined4 uStack_850;
  undefined3 uStack_84c;
  HLSLBindingFlags local_848;
  undefined2 local_844;
  undefined2 local_842;
  bool local_840;
  undefined1 local_830 [1880];
  uint *local_d8;
  size_t local_d0;
  uint local_c0 [8];
  pair<unsigned_int,_unsigned_int> *local_a0;
  size_t local_98;
  pair<unsigned_int,_unsigned_int> local_88 [11];
  
  local_1868._88_8_ = local_1868 + 0x70;
  local_1868._32_4_ = 0;
  local_1868[0x24] = false;
  local_1868[0x25] = false;
  local_1868[0x26] = false;
  local_1868[0x27] = false;
  local_1868[0x28] = false;
  local_1868[0x29] = false;
  local_1868[0x2a] = false;
  local_1868[0x2b] = false;
  local_1868[0x2c] = false;
  local_1868[0x2d] = false;
  local_1868[0x2e] = false;
  local_1868._16_8_ = (char *)0x0;
  local_1868._24_7_ = 0;
  local_1868[0x1f] = 0;
  local_1868._0_8_ = (char *)0x0;
  local_1868._8_8_ = (char *)0x0;
  local_1868[0x2f] = true;
  local_1868[0x30] = false;
  local_1868[0x31] = false;
  local_1868[0x32] = false;
  local_1868[0x33] = false;
  local_1868[0x34] = false;
  local_1868[0x35] = false;
  local_1868[0x36] = false;
  local_1868[0x37] = false;
  local_1868[0x38] = false;
  local_1868[0x39] = false;
  local_1868[0x3a] = false;
  local_1868[0x3b] = true;
  local_1868[0x3c] = false;
  local_1868[0x3d] = false;
  local_1868[0x3e] = false;
  local_1868[0x3f] = false;
  local_1868[0x40] = false;
  local_1868[0x41] = true;
  local_1868[0x42] = true;
  local_1868._68_4_ = 0xffffffff;
  local_1868[0x48] = true;
  local_1868[0x49] = false;
  local_1868[0x4a] = false;
  local_1868._76_4_ = 0xffffffff;
  local_1868[0x50] = false;
  local_1868[0x51] = false;
  local_1868[0x52] = false;
  local_1868[0x53] = false;
  local_1868._96_8_ = 0;
  local_1868._104_8_ = 8;
  local_17b8._0_1_ = false;
  local_17b8._1_1_ = false;
  local_17b8._2_1_ = true;
  local_17b8._3_1_ = false;
  local_17b0 = local_1798;
  sStack_17a8 = 0;
  local_17a0 = 8;
  local_1778 = local_1760;
  sStack_1770 = 0;
  local_1768 = 8;
  local_1740 = local_1728;
  sStack_1738 = 0;
  local_1730 = 8;
  local_16e8 = local_16d0;
  sStack_16e0 = 0;
  local_16d8 = 8;
  local_1690 = local_1678;
  sStack_1688 = 0;
  local_1680 = 8;
  local_15f8 = local_15e0;
  sStack_15f0 = 0;
  local_15e8 = 8;
  local_14a0 = local_1488;
  sStack_1498 = 0;
  local_1490 = 8;
  local_1348 = local_1330;
  sStack_1340 = 0;
  local_1338 = 8;
  local_10f0 = local_10d8;
  sStack_10e8 = 0;
  local_10e0 = 8;
  local_fd8 = local_fc0;
  sStack_fd0 = 0;
  local_fc8 = 8;
  local_dc0 = local_da8;
  sStack_db8 = 0;
  local_db0 = 8;
  local_c68 = local_c50;
  sStack_c60 = 0;
  local_c58 = 8;
  local_b10._M_p = (pointer)&local_b00;
  local_b08 = 0;
  local_b00._M_local_buf[0] = '\0';
  local_af0._M_p = (pointer)&local_ae0;
  local_ae8 = 0;
  local_ae0._M_local_buf[0] = '\0';
  local_ad0 = local_ab8;
  sStack_ac8 = 0;
  local_ac0 = 8;
  local_878 = 1;
  local_874 = false;
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  local_870._M_string_length = 0;
  local_870.field_2._M_local_buf[0] = '\0';
  local_848 = 0;
  local_844._0_1_ = false;
  local_844._1_1_ = false;
  uStack_84c._0_1_ = false;
  uStack_84c._1_1_ = false;
  uStack_84c._2_1_ = false;
  uStack_850._0_1_ = false;
  uStack_850._1_1_ = false;
  uStack_850._2_1_ = false;
  uStack_850._3_1_ = false;
  local_842._0_1_ = true;
  local_842._1_1_ = false;
  local_840 = false;
  local_3ea0.callbacks._M_h._M_buckets = &local_3ea0.callbacks._M_h._M_single_bucket;
  local_3ea0.callbacks._M_h._M_bucket_count = 1;
  local_3ea0.callbacks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_3ea0.callbacks._M_h._M_element_count = 0;
  local_3ea0.callbacks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_3ea0.callbacks._M_h._M_rehash_policy._M_next_resize = 0;
  local_3ea0.callbacks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_3ea0.error_handler.super__Function_base._M_functor._M_unused._M_object =
       (_Manager_type *)0x0;
  local_3ea0.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_3ea0.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_3ea0.error_handler._M_invoker = (_Invoker_type)0x0;
  local_3ea0.default_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3ea0.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_3ea0.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_3ea0.default_handler._M_invoker = (_Invoker_type)0x0;
  local_3c98[0] = (undefined **)0x0;
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1300:20)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1300:20)>
               ::_M_manager;
  CLICallbacks::add(&local_3ea0,"--help",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[0] = (undefined **)0x0;
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1304:24)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1304:24)>
               ::_M_manager;
  CLICallbacks::add(&local_3ea0,"--revision",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1308:22)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1308:22)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--output",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1309:18)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1309:18)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--es",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1313:21)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1313:21)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--no-es",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1317:23)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1317:23)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--version",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1321:30)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1321:30)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--dump-resources",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1322:31)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1322:31)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--force-temporary",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1323:27)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1323:27)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--flatten-ubo",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1324:31)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1324:31)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--fixup-clipspace",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1325:27)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1325:27)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--flip-vert-y",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1326:26)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1326:26)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--iterations",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1327:19)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1327:19)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--cpp",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1328:23)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1328:23)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--reflect",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1329:34)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1329:34)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--cpp-interface-name",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1330:21)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1330:21)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--metal",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1331:46)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1331:46)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--glsl-emit-push-constant-as-ubo",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1332:47)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1332:47)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--glsl-emit-ubo-as-plain-uniforms",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1333:46)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1333:46)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--glsl-force-flattened-io-blocks",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1334:48)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1334:48)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--glsl-remap-ext-framebuffer-fetch",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1340:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1340:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--vulkan-glsl-disable-ext-samplerless-texture-functions",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1342:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1342:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--disable-storage-image-qualifier-deduction",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1344:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1344:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--force-zero-initialized-variables",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1345:19)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1345:19)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1346:20)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1346:20)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--hlsl",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1347:34)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1347:34)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--hlsl-enable-compat",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1349:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1349:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--hlsl-support-nonzero-basevertex-baseinstance",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1350:33)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1350:33)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--hlsl-auto-binding",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1354:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1354:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--hlsl-force-storage-buffer-as-uav",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1356:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1356:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--hlsl-nonwritable-uav-texture-as-srv",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1357:39)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1357:39)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--hlsl-enable-16bit-types",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1358:32)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1358:32)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--vulkan-semantics",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1359:16)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1359:16)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"-V",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1360:47)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1360:47)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--flatten-multidimensional-arrays",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1361:36)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1361:36)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--no-420pack-extension",(function<void_(CLIParser_&)> *)local_3c98)
  ;
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1362:34)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1362:34)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-capture-output",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1363:43)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1363:43)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-swizzle-texture-samples",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1364:23)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1364:23)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-ios",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1365:39)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1365:39)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-pad-fragment-output",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1366:37)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1366:37)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-domain-lower-left",(function<void_(CLIParser_&)> *)local_3c98
                   );
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1367:36)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1367:36)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-argument-buffers",(function<void_(CLIParser_&)> *)local_3c98)
  ;
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1369:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1369:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-discrete-descriptor-set",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1371:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1371:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-device-argument-buffer",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1372:41)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1372:41)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-texture-buffer-native",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1373:37)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1373:37)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-framebuffer-fetch",(function<void_(CLIParser_&)> *)local_3c98
                   );
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1374:40)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1374:40)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-invariant-float-math",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1375:38)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1375:38)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-emulate-cube-array",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1376:29)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1376:29)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-multiview",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1378:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1378:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-multiview-no-layered-rendering",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1380:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1380:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-view-index-from-device-index",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1381:33)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1381:33)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-dispatch-base",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1382:34)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1382:34)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-dynamic-buffer",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1389:38)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1389:38)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-decoration-binding",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1391:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1391:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-force-active-argument-buffer-resources",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1392:40)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1392:40)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-inline-uniform-block",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1399:39)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1399:39)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-force-native-arrays",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1400:46)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1400:46)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-disable-frag-depth-builtin",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1402:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1402:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-disable-frag-stencil-ref-builtin",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1404:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1404:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-enable-frag-output-mask",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1406:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1406:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-no-clip-distance-user-varying",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1407:32)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1407:32)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-shader-input",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1425:41)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1425:41)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-multi-patch-workgroup",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1426:43)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1426:43)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-vertex-for-tessellation",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1428:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1428:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-additional-fixed-sample-mask",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1429:41)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1429:41)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-arrayed-subpass-input",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1430:25)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1430:25)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--extension",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1431:34)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1431:34)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--rename-entry-point",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1437:21)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1437:21)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--entry",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1438:21)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1438:21)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--stage",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1439:39)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1439:39)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--separate-shader-objects",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1440:46)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1440:46)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--set-hlsl-vertex-input-semantic",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1447:21)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1447:21)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--remap",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1454:35)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1454:35)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--remap-variable-type",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1460:41)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1460:41)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--rename-interface-variable",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1473:22)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1473:22)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--pls-in",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1478:23)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1478:23)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--pls-out",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1483:28)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1483:28)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--shader-model",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1487:27)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1487:27)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--msl-version",(function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1492:39)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1492:39)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--remove-unused-variables",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1494:10)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1494:10)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--combined-samplers-inherit-bindings",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1496:47)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1496:47)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--no-support-nonzero-baseinstance",
                    (function<void_(CLIParser_&)> *)local_3c98);
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  local_3c98[1] = (undefined **)0x0;
  p_Stack_3c80 = std::
                 _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1497:36)>
                 ::_M_invoke;
  local_3c88 = std::
               _Function_handler<void_(CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1497:36)>
               ::_M_manager;
  local_3c98[0] = (undefined **)local_1868;
  CLICallbacks::add(&local_3ea0,"--emit-line-directives",(function<void_(CLIParser_&)> *)local_3c98)
  ;
  if (local_3c88 != (_Manager_type)0x0) {
    (*local_3c88)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  p_Var3 = local_3ea0.default_handler.super__Function_base._M_manager;
  local_3c98[0] =
       (undefined **)local_3ea0.default_handler.super__Function_base._M_functor._M_unused._0_8_;
  local_3c98[1] = (undefined **)local_3ea0.default_handler.super__Function_base._M_functor._8_8_;
  local_3ea0.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_3c88 = local_3ea0.default_handler.super__Function_base._M_manager;
  local_3ea0.default_handler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1499:24)>
       ::_M_manager;
  p_Stack_3c80 = local_3ea0.default_handler._M_invoker;
  local_3ea0.default_handler._M_invoker =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1499:24)>
       ::_M_invoke;
  local_3ea0.default_handler.super__Function_base._M_functor._M_unused._0_8_ = local_1868;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  p_Var3 = local_3ea0.error_handler.super__Function_base._M_manager;
  local_3c98[0] =
       (undefined **)local_3ea0.error_handler.super__Function_base._M_functor._M_unused._0_8_;
  local_3c98[1] = (undefined **)local_3ea0.error_handler.super__Function_base._M_functor._8_8_;
  local_3ea0.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3ea0.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_3c88 = local_3ea0.error_handler.super__Function_base._M_manager;
  local_3ea0.error_handler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1500:22)>
       ::_M_manager;
  p_Stack_3c80 = (_Invoker_type)local_3ea0.error_handler._M_invoker;
  local_3ea0.error_handler._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/main.cpp:1500:22)>
       ::_M_invoke;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)local_3c98,(_Any_data *)local_3c98,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&local_3da0,&local_3ea0,&local_3ea0);
  local_3da0.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3da0.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_3da0.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_3da0.error_handler._M_invoker = local_3ea0.error_handler._M_invoker;
  if (local_3ea0.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_3da0.error_handler.super__Function_base._M_functor._M_unused._M_object =
         local_3ea0.error_handler.super__Function_base._M_functor._M_unused._M_object;
    local_3da0.error_handler.super__Function_base._M_functor._8_8_ =
         local_3ea0.error_handler.super__Function_base._M_functor._8_8_;
    local_3da0.error_handler.super__Function_base._M_manager =
         local_3ea0.error_handler.super__Function_base._M_manager;
    local_3ea0.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
    local_3ea0.error_handler._M_invoker = (_Invoker_type)0x0;
  }
  local_3da0.default_handler.super__Function_base._M_functor._M_unused._M_object = (undefined1 *)0x0
  ;
  local_3da0.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_3da0.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_3da0.default_handler._M_invoker = local_3ea0.default_handler._M_invoker;
  if (local_3ea0.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_3da0.default_handler.super__Function_base._M_functor._M_unused._M_object =
         local_3ea0.default_handler.super__Function_base._M_functor._M_unused._M_object;
    local_3da0.default_handler.super__Function_base._M_functor._8_8_ =
         local_3ea0.default_handler.super__Function_base._M_functor._8_8_;
    local_3da0.default_handler.super__Function_base._M_manager =
         local_3ea0.default_handler.super__Function_base._M_manager;
    local_3ea0.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
    local_3ea0.default_handler._M_invoker = (_Invoker_type)0x0;
  }
  CLIParser::CLIParser(&local_3d28,&local_3da0,argc + -1,argv + 1);
  if (local_3da0.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3da0.default_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_3da0.default_handler,(_Any_data *)&local_3da0.default_handler,
               __destroy_functor);
  }
  if (local_3da0.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3da0.error_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_3da0.error_handler,(_Any_data *)&local_3da0.error_handler,
               __destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_3da0);
  bVar5 = CLIParser::parse(&local_3d28);
  uVar4 = local_1868._0_8_;
  iVar8 = 1;
  if ((bVar5) && (iVar8 = 0, local_3d28.ended_state == false)) {
    if ((char *)local_1868._0_8_ == (char *)0x0) {
      main_inner();
      iVar8 = 1;
    }
    else {
      __stream = fopen((char *)local_1868._0_8_,"rb");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"Failed to open SPIR-V file: %s\n",uVar4);
        local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        fseek(__stream,0,2);
        uVar6 = ftell(__stream);
        uVar6 = uVar6 >> 2;
        rewind(__stream);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_3e28,uVar6,(allocator_type *)local_3c98);
        sVar7 = fread(local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,4,uVar6,__stream);
        if ((sVar7 != uVar6) &&
           (local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start)) {
          local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        fclose(__stream);
      }
      if (local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar8 = 1;
      }
      else {
        if (local_870._M_string_length == 0) {
          local_3c98[0] = &local_3c88;
          local_3c98[1] = (undefined **)0x0;
          local_3c88 = (_Manager_type)((ulong)local_3c88 & 0xffffffffffffff00);
          if (local_878 == 1) {
            local_3df0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_3df0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_3df0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            compile_iteration_abi_cxx11_((string *)local_830,(CLIArguments *)local_1868,&local_3df0)
            ;
            std::__cxx11::string::operator=((string *)local_3c98,(string *)local_830);
            if ((ObjectPoolGroup *)local_830._0_8_ != (ObjectPoolGroup *)(local_830 + 0x10)) {
              operator_delete((void *)local_830._0_8_);
            }
            if (local_3df0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_3df0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else if (local_878 != 0) {
            uVar9 = 0;
            do {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_3e08,&local_3e28);
              compile_iteration_abi_cxx11_
                        ((string *)local_830,(CLIArguments *)local_1868,&local_3e08);
              std::__cxx11::string::operator=((string *)local_3c98,(string *)local_830);
              if ((ObjectPoolGroup *)local_830._0_8_ != (ObjectPoolGroup *)(local_830 + 0x10)) {
                operator_delete((void *)local_830._0_8_);
              }
              if (local_3e08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3e08.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < local_878);
          }
          if ((char *)local_1868._8_8_ == (char *)0x0) {
            printf("%s");
          }
          else {
            write_string_to_file((char *)local_1868._8_8_,(char *)local_3c98[0]);
          }
          if ((_Manager_type *)local_3c98[0] != &local_3c88) {
            operator_delete(local_3c98[0]);
          }
        }
        else {
          local_3dd8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_3dd8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_3dd8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          spirv_cross::Parser::Parser((Parser *)local_830,&local_3dd8);
          if (local_3dd8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3dd8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          spirv_cross::Parser::parse((Parser *)local_830);
          spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)local_3c98,(ParsedIR *)local_830);
          local_3c98[0] = &PTR__CompilerReflection_0035ba00;
          local_1878 = (element_type *)0x0;
          p_Stack_1870 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1f82 = true;
          spirv_cross::CompilerReflection::set_format((CompilerReflection *)local_3c98,&local_870);
          spirv_cross::CompilerReflection::compile_abi_cxx11_
                    (&local_3dc0,(CompilerReflection *)local_3c98);
          if ((char *)local_1868._8_8_ == (char *)0x0) {
            printf("%s");
          }
          else {
            write_string_to_file((char *)local_1868._8_8_,local_3dc0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3dc0._M_dataplus._M_p != &local_3dc0.field_2) {
            operator_delete(local_3dc0._M_dataplus._M_p);
          }
          local_3c98[0] = &PTR__CompilerReflection_0035ba00;
          if (p_Stack_1870 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1870);
          }
          spirv_cross::CompilerGLSL::~CompilerGLSL((CompilerGLSL *)local_3c98);
          local_98 = 0;
          if (local_a0 != local_88) {
            free(local_a0);
          }
          local_d0 = 0;
          if (local_d8 != local_c0) {
            free(local_d8);
          }
          spirv_cross::ParsedIR::~ParsedIR((ParsedIR *)local_830);
        }
        iVar8 = 0;
      }
      if (local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  if (local_3d28.cbs.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_3d28.cbs.default_handler;
    (*local_3d28.cbs.default_handler.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if (local_3d28.cbs.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar2 = &local_3d28.cbs.error_handler;
    (*local_3d28.cbs.error_handler.super__Function_base._M_manager)
              ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_3d28);
  if (local_3ea0.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3ea0.default_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_3ea0.default_handler,(_Any_data *)&local_3ea0.default_handler,
               __destroy_functor);
  }
  if (local_3ea0.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3ea0.error_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_3ea0.error_handler,(_Any_data *)&local_3ea0.error_handler,
               __destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_3ea0);
  CLIArguments::~CLIArguments((CLIArguments *)local_1868);
  return iVar8;
}

Assistant:

static int main_inner(int argc, char *argv[])
{
	CLIArguments args;
	CLICallbacks cbs;

	cbs.add("--help", [](CLIParser &parser) {
		print_help();
		parser.end();
	});
	cbs.add("--revision", [](CLIParser &parser) {
		print_version();
		parser.end();
	});
	cbs.add("--output", [&args](CLIParser &parser) { args.output = parser.next_string(); });
	cbs.add("--es", [&args](CLIParser &) {
		args.es = true;
		args.set_es = true;
	});
	cbs.add("--no-es", [&args](CLIParser &) {
		args.es = false;
		args.set_es = true;
	});
	cbs.add("--version", [&args](CLIParser &parser) {
		args.version = parser.next_uint();
		args.set_version = true;
	});
	cbs.add("--dump-resources", [&args](CLIParser &) { args.dump_resources = true; });
	cbs.add("--force-temporary", [&args](CLIParser &) { args.force_temporary = true; });
	cbs.add("--flatten-ubo", [&args](CLIParser &) { args.flatten_ubo = true; });
	cbs.add("--fixup-clipspace", [&args](CLIParser &) { args.fixup = true; });
	cbs.add("--flip-vert-y", [&args](CLIParser &) { args.yflip = true; });
	cbs.add("--iterations", [&args](CLIParser &parser) { args.iterations = parser.next_uint(); });
	cbs.add("--cpp", [&args](CLIParser &) { args.cpp = true; });
	cbs.add("--reflect", [&args](CLIParser &parser) { args.reflect = parser.next_value_string("json"); });
	cbs.add("--cpp-interface-name", [&args](CLIParser &parser) { args.cpp_interface_name = parser.next_string(); });
	cbs.add("--metal", [&args](CLIParser &) { args.msl = true; }); // Legacy compatibility
	cbs.add("--glsl-emit-push-constant-as-ubo", [&args](CLIParser &) { args.glsl_emit_push_constant_as_ubo = true; });
	cbs.add("--glsl-emit-ubo-as-plain-uniforms", [&args](CLIParser &) { args.glsl_emit_ubo_as_plain_uniforms = true; });
	cbs.add("--glsl-force-flattened-io-blocks", [&args](CLIParser &) { args.glsl_force_flattened_io_blocks = true; });
	cbs.add("--glsl-remap-ext-framebuffer-fetch", [&args](CLIParser &parser) {
		uint32_t input_index = parser.next_uint();
		uint32_t color_attachment = parser.next_uint();
		args.glsl_ext_framebuffer_fetch.push_back({ input_index, color_attachment });
	});
	cbs.add("--vulkan-glsl-disable-ext-samplerless-texture-functions",
	        [&args](CLIParser &) { args.vulkan_glsl_disable_ext_samplerless_texture_functions = true; });
	cbs.add("--disable-storage-image-qualifier-deduction",
	        [&args](CLIParser &) { args.enable_storage_image_qualifier_deduction = false; });
	cbs.add("--force-zero-initialized-variables",
	        [&args](CLIParser &) { args.force_zero_initialized_variables = true; });
	cbs.add("--msl", [&args](CLIParser &) { args.msl = true; });
	cbs.add("--hlsl", [&args](CLIParser &) { args.hlsl = true; });
	cbs.add("--hlsl-enable-compat", [&args](CLIParser &) { args.hlsl_compat = true; });
	cbs.add("--hlsl-support-nonzero-basevertex-baseinstance",
	        [&args](CLIParser &) { args.hlsl_support_nonzero_base = true; });
	cbs.add("--hlsl-auto-binding", [&args](CLIParser &parser) {
		args.hlsl_binding_flags |= hlsl_resource_type_to_flag(parser.next_string());
	});
	cbs.add("--hlsl-force-storage-buffer-as-uav",
	        [&args](CLIParser &) { args.hlsl_force_storage_buffer_as_uav = true; });
	cbs.add("--hlsl-nonwritable-uav-texture-as-srv",
	        [&args](CLIParser &) { args.hlsl_nonwritable_uav_texture_as_srv = true; });
	cbs.add("--hlsl-enable-16bit-types", [&args](CLIParser &) { args.hlsl_enable_16bit_types = true; });
	cbs.add("--vulkan-semantics", [&args](CLIParser &) { args.vulkan_semantics = true; });
	cbs.add("-V", [&args](CLIParser &) { args.vulkan_semantics = true; });
	cbs.add("--flatten-multidimensional-arrays", [&args](CLIParser &) { args.flatten_multidimensional_arrays = true; });
	cbs.add("--no-420pack-extension", [&args](CLIParser &) { args.use_420pack_extension = false; });
	cbs.add("--msl-capture-output", [&args](CLIParser &) { args.msl_capture_output_to_buffer = true; });
	cbs.add("--msl-swizzle-texture-samples", [&args](CLIParser &) { args.msl_swizzle_texture_samples = true; });
	cbs.add("--msl-ios", [&args](CLIParser &) { args.msl_ios = true; });
	cbs.add("--msl-pad-fragment-output", [&args](CLIParser &) { args.msl_pad_fragment_output = true; });
	cbs.add("--msl-domain-lower-left", [&args](CLIParser &) { args.msl_domain_lower_left = true; });
	cbs.add("--msl-argument-buffers", [&args](CLIParser &) { args.msl_argument_buffers = true; });
	cbs.add("--msl-discrete-descriptor-set",
	        [&args](CLIParser &parser) { args.msl_discrete_descriptor_sets.push_back(parser.next_uint()); });
	cbs.add("--msl-device-argument-buffer",
	        [&args](CLIParser &parser) { args.msl_device_argument_buffers.push_back(parser.next_uint()); });
	cbs.add("--msl-texture-buffer-native", [&args](CLIParser &) { args.msl_texture_buffer_native = true; });
	cbs.add("--msl-framebuffer-fetch", [&args](CLIParser &) { args.msl_framebuffer_fetch = true; });
	cbs.add("--msl-invariant-float-math", [&args](CLIParser &) { args.msl_invariant_float_math = true; });
	cbs.add("--msl-emulate-cube-array", [&args](CLIParser &) { args.msl_emulate_cube_array = true; });
	cbs.add("--msl-multiview", [&args](CLIParser &) { args.msl_multiview = true; });
	cbs.add("--msl-multiview-no-layered-rendering",
	        [&args](CLIParser &) { args.msl_multiview_layered_rendering = false; });
	cbs.add("--msl-view-index-from-device-index",
	        [&args](CLIParser &) { args.msl_view_index_from_device_index = true; });
	cbs.add("--msl-dispatch-base", [&args](CLIParser &) { args.msl_dispatch_base = true; });
	cbs.add("--msl-dynamic-buffer", [&args](CLIParser &parser) {
		args.msl_argument_buffers = true;
		// Make sure next_uint() is called in-order.
		uint32_t desc_set = parser.next_uint();
		uint32_t binding = parser.next_uint();
		args.msl_dynamic_buffers.push_back(make_pair(desc_set, binding));
	});
	cbs.add("--msl-decoration-binding", [&args](CLIParser &) { args.msl_decoration_binding = true; });
	cbs.add("--msl-force-active-argument-buffer-resources",
	        [&args](CLIParser &) { args.msl_force_active_argument_buffer_resources = true; });
	cbs.add("--msl-inline-uniform-block", [&args](CLIParser &parser) {
		args.msl_argument_buffers = true;
		// Make sure next_uint() is called in-order.
		uint32_t desc_set = parser.next_uint();
		uint32_t binding = parser.next_uint();
		args.msl_inline_uniform_blocks.push_back(make_pair(desc_set, binding));
	});
	cbs.add("--msl-force-native-arrays", [&args](CLIParser &) { args.msl_force_native_arrays = true; });
	cbs.add("--msl-disable-frag-depth-builtin", [&args](CLIParser &) { args.msl_enable_frag_depth_builtin = false; });
	cbs.add("--msl-disable-frag-stencil-ref-builtin",
	        [&args](CLIParser &) { args.msl_enable_frag_stencil_ref_builtin = false; });
	cbs.add("--msl-enable-frag-output-mask",
	        [&args](CLIParser &parser) { args.msl_enable_frag_output_mask = parser.next_hex_uint(); });
	cbs.add("--msl-no-clip-distance-user-varying",
	        [&args](CLIParser &) { args.msl_enable_clip_distance_user_varying = false; });
	cbs.add("--msl-shader-input", [&args](CLIParser &parser) {
		MSLShaderInput input;
		// Make sure next_uint() is called in-order.
		input.location = parser.next_uint();
		const char *format = parser.next_value_string("other");
		if (strcmp(format, "any32") == 0)
			input.format = MSL_SHADER_INPUT_FORMAT_ANY32;
		else if (strcmp(format, "any16") == 0)
			input.format = MSL_SHADER_INPUT_FORMAT_ANY16;
		else if (strcmp(format, "u16") == 0)
			input.format = MSL_SHADER_INPUT_FORMAT_UINT16;
		else if (strcmp(format, "u8") == 0)
			input.format = MSL_SHADER_INPUT_FORMAT_UINT8;
		else
			input.format = MSL_SHADER_INPUT_FORMAT_OTHER;
		input.vecsize = parser.next_uint();
		args.msl_shader_inputs.push_back(input);
	});
	cbs.add("--msl-multi-patch-workgroup", [&args](CLIParser &) { args.msl_multi_patch_workgroup = true; });
	cbs.add("--msl-vertex-for-tessellation", [&args](CLIParser &) { args.msl_vertex_for_tessellation = true; });
	cbs.add("--msl-additional-fixed-sample-mask",
	        [&args](CLIParser &parser) { args.msl_additional_fixed_sample_mask = parser.next_hex_uint(); });
	cbs.add("--msl-arrayed-subpass-input", [&args](CLIParser &) { args.msl_arrayed_subpass_input = true; });
	cbs.add("--extension", [&args](CLIParser &parser) { args.extensions.push_back(parser.next_string()); });
	cbs.add("--rename-entry-point", [&args](CLIParser &parser) {
		auto old_name = parser.next_string();
		auto new_name = parser.next_string();
		auto model = stage_to_execution_model(parser.next_string());
		args.entry_point_rename.push_back({ old_name, new_name, move(model) });
	});
	cbs.add("--entry", [&args](CLIParser &parser) { args.entry = parser.next_string(); });
	cbs.add("--stage", [&args](CLIParser &parser) { args.entry_stage = parser.next_string(); });
	cbs.add("--separate-shader-objects", [&args](CLIParser &) { args.sso = true; });
	cbs.add("--set-hlsl-vertex-input-semantic", [&args](CLIParser &parser) {
		HLSLVertexAttributeRemap remap;
		remap.location = parser.next_uint();
		remap.semantic = parser.next_string();
		args.hlsl_attr_remap.push_back(move(remap));
	});

	cbs.add("--remap", [&args](CLIParser &parser) {
		string src = parser.next_string();
		string dst = parser.next_string();
		uint32_t components = parser.next_uint();
		args.remaps.push_back({ move(src), move(dst), components });
	});

	cbs.add("--remap-variable-type", [&args](CLIParser &parser) {
		string var_name = parser.next_string();
		string new_type = parser.next_string();
		args.variable_type_remaps.push_back({ move(var_name), move(new_type) });
	});

	cbs.add("--rename-interface-variable", [&args](CLIParser &parser) {
		StorageClass cls = StorageClassMax;
		string clsStr = parser.next_string();
		if (clsStr == "in")
			cls = StorageClassInput;
		else if (clsStr == "out")
			cls = StorageClassOutput;

		uint32_t loc = parser.next_uint();
		string var_name = parser.next_string();
		args.interface_variable_renames.push_back({ cls, loc, move(var_name) });
	});

	cbs.add("--pls-in", [&args](CLIParser &parser) {
		auto fmt = pls_format(parser.next_string());
		auto name = parser.next_string();
		args.pls_in.push_back({ move(fmt), move(name) });
	});
	cbs.add("--pls-out", [&args](CLIParser &parser) {
		auto fmt = pls_format(parser.next_string());
		auto name = parser.next_string();
		args.pls_out.push_back({ move(fmt), move(name) });
	});
	cbs.add("--shader-model", [&args](CLIParser &parser) {
		args.shader_model = parser.next_uint();
		args.set_shader_model = true;
	});
	cbs.add("--msl-version", [&args](CLIParser &parser) {
		args.msl_version = parser.next_uint();
		args.set_msl_version = true;
	});

	cbs.add("--remove-unused-variables", [&args](CLIParser &) { args.remove_unused = true; });
	cbs.add("--combined-samplers-inherit-bindings",
	        [&args](CLIParser &) { args.combined_samplers_inherit_bindings = true; });

	cbs.add("--no-support-nonzero-baseinstance", [&](CLIParser &) { args.support_nonzero_baseinstance = false; });
	cbs.add("--emit-line-directives", [&args](CLIParser &) { args.emit_line_directives = true; });

	cbs.default_handler = [&args](const char *value) { args.input = value; };
	cbs.error_handler = [] { print_help(); };

	CLIParser parser{ move(cbs), argc - 1, argv + 1 };
	if (!parser.parse())
		return EXIT_FAILURE;
	else if (parser.ended_state)
		return EXIT_SUCCESS;

	if (!args.input)
	{
		fprintf(stderr, "Didn't specify input file.\n");
		print_help();
		return EXIT_FAILURE;
	}

	auto spirv_file = read_spirv_file(args.input);
	if (spirv_file.empty())
		return EXIT_FAILURE;

	// Special case reflection because it has little to do with the path followed by code-outputting compilers
	if (!args.reflect.empty())
	{
		Parser spirv_parser(move(spirv_file));
		spirv_parser.parse();

		CompilerReflection compiler(move(spirv_parser.get_parsed_ir()));
		compiler.set_format(args.reflect);
		auto json = compiler.compile();
		if (args.output)
			write_string_to_file(args.output, json.c_str());
		else
			printf("%s", json.c_str());
		return EXIT_SUCCESS;
	}

	string compiled_output;

	if (args.iterations == 1)
		compiled_output = compile_iteration(args, move(spirv_file));
	else
	{
		for (unsigned i = 0; i < args.iterations; i++)
			compiled_output = compile_iteration(args, spirv_file);
	}

	if (args.output)
		write_string_to_file(args.output, compiled_output.c_str());
	else
		printf("%s", compiled_output.c_str());

	return EXIT_SUCCESS;
}